

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O0

MPP_RET hal_vp8e_vepu2_gen_regs_v2(void *hal,HalEncTask *task)

{
  MPP_RET MVar1;
  RK_S32 local_38;
  RK_S32 local_34;
  HalVp8eCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  if ((task->rc_task->info).quality_target < 0) {
    local_34 = 0;
  }
  else {
    if ((task->rc_task->info).quality_target < 0x80) {
      local_38 = (task->rc_task->info).quality_target;
    }
    else {
      local_38 = 0x7f;
    }
    local_34 = local_38;
  }
  *(RK_S32 *)(*(long *)((long)hal + 0x158) + 0x18) = local_34;
  if (*(int *)((long)hal + 0x6910) == 0) {
    MVar1 = hal_vp8e_setup(hal);
    if (MVar1 != MPP_OK) {
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","failed to init hal vp8e\n",(char *)0x0);
      return MVar1;
    }
    *(undefined4 *)((long)hal + 0x6910) = 1;
  }
  memset((void *)((long)hal + 0x68e8),0,0x24);
  hal_vp8e_enc_strm_code(hal,task);
  vp8e_vpu_frame_start(hal);
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_gen_regs_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    ctx->rc->qp_hdr = MPP_CLIP3(0, 127, task->rc_task->info.quality_target);

    if (!ctx->buffer_ready) {
        ret = hal_vp8e_setup(hal);
        if (ret) {
            mpp_err("failed to init hal vp8e\n");
            return ret;
        } else {
            ctx->buffer_ready = 1;
        }
    }

    memset(ctx->stream_size, 0, sizeof(ctx->stream_size));

    hal_vp8e_enc_strm_code(ctx, task);
    vp8e_vpu_frame_start(ctx);

    return MPP_OK;
}